

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

arena_t * arena_init(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  int iVar1;
  arena_t *paVar2;
  mutex_prof_data_t *data;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&arenas_lock.field_0 + 0x40));
  if (iVar1 != 0) {
    malloc_mutex_lock_slow(&arenas_lock);
    arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  arenas_lock.field_0.field_0.prof_data.n_lock_ops =
       arenas_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (arenas_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    arenas_lock.field_0.witness.link.qre_prev =
         (witness_t *)(arenas_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    arenas_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  paVar2 = arena_init_locked(tsdn,ind,extent_hooks);
  arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&arenas_lock.field_0 + 0x40));
  arena_new_create_background_thread(tsdn,ind);
  return paVar2;
}

Assistant:

arena_t *
arena_init(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	arena_t *arena;

	malloc_mutex_lock(tsdn, &arenas_lock);
	arena = arena_init_locked(tsdn, ind, extent_hooks);
	malloc_mutex_unlock(tsdn, &arenas_lock);

	arena_new_create_background_thread(tsdn, ind);

	return arena;
}